

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

void decFinalize(decNumber *dn,decContext *set,int32_t *residue,uint32_t *status)

{
  int shift_00;
  int32_t iVar1;
  undefined1 local_40 [8];
  decNumber nmin;
  int32_t comp;
  int32_t tinyexp;
  int32_t shift;
  uint32_t *status_local;
  int32_t *residue_local;
  decContext *set_local;
  decNumber *dn_local;
  
  nmin._8_4_ = (set->emin - dn->digits) + 1;
  if (dn->exponent <= (int)nmin._8_4_) {
    if (dn->exponent < (int)nmin._8_4_) {
      decSetSubnormal(dn,set,residue,status);
      return;
    }
    uprv_decNumberZero_63((decNumber *)local_40);
    nmin.digits._1_1_ = 1;
    local_40._4_4_ = set->emin;
    nmin.exponent = decCompare(dn,(decNumber *)local_40,'\x01');
    if (nmin.exponent == -0x80000000) {
      *status = *status | 0x10;
      return;
    }
    if ((*residue < 0) && (nmin.exponent == 0)) {
      decApplyRound(dn,set,*residue,status);
      decSetSubnormal(dn,set,residue,status);
      return;
    }
  }
  if (*residue != 0) {
    decApplyRound(dn,set,*residue,status);
  }
  if ((set->emax - set->digits) + 1 < dn->exponent) {
    if ((set->emax - dn->digits) + 1 < dn->exponent) {
      decSetOverflow(dn,set,status);
    }
    else if (set->clamp != '\0') {
      shift_00 = dn->exponent - ((set->emax - set->digits) + 1);
      if (((dn->lsu[0] != '\0') || (dn->digits != 1)) || ((dn->bits & 0x70) != 0)) {
        iVar1 = decShiftToMost(dn->lsu,dn->digits,shift_00);
        dn->digits = iVar1;
      }
      dn->exponent = dn->exponent - shift_00;
      *status = *status | 0x400;
    }
  }
  return;
}

Assistant:

static void decFinalize(decNumber *dn, decContext *set, Int *residue,
                        uInt *status) {
  Int shift;                            /* shift needed if clamping  */
  Int tinyexp=set->emin-dn->digits+1;   /* precalculate subnormal boundary  */

  /* Must be careful, here, when checking the exponent as the  */
  /* adjusted exponent could overflow 31 bits [because it may already  */
  /* be up to twice the expected].  */

  /* First test for subnormal.  This must be done before any final  */
  /* round as the result could be rounded to Nmin or 0.  */
  if (dn->exponent<=tinyexp) {          /* prefilter  */
    Int comp;
    decNumber nmin;
    /* A very nasty case here is dn == Nmin and residue<0  */
    if (dn->exponent<tinyexp) {
      /* Go handle subnormals; this will apply round if needed.  */
      decSetSubnormal(dn, set, residue, status);
      return;
      }
    /* Equals case: only subnormal if dn=Nmin and negative residue  */
    uprv_decNumberZero(&nmin);
    nmin.lsu[0]=1;
    nmin.exponent=set->emin;
    comp=decCompare(dn, &nmin, 1);                /* (signless compare)  */
    if (comp==BADINT) {                           /* oops  */
      *status|=DEC_Insufficient_storage;          /* abandon...  */
      return;
      }
    if (*residue<0 && comp==0) {                  /* neg residue and dn==Nmin  */
      decApplyRound(dn, set, *residue, status);   /* might force down  */
      decSetSubnormal(dn, set, residue, status);
      return;
      }
    }

  /* now apply any pending round (this could raise overflow).  */
  if (*residue!=0) decApplyRound(dn, set, *residue, status);

  /* Check for overflow [redundant in the 'rare' case] or clamp  */
  if (dn->exponent<=set->emax-set->digits+1) return;   /* neither needed  */


  /* here when might have an overflow or clamp to do  */
  if (dn->exponent>set->emax-dn->digits+1) {           /* too big  */
    decSetOverflow(dn, set, status);
    return;
    }
  /* here when the result is normal but in clamp range  */
  if (!set->clamp) return;

  /* here when need to apply the IEEE exponent clamp (fold-down)  */
  shift=dn->exponent-(set->emax-set->digits+1);

  /* shift coefficient (if non-zero)  */
  if (!ISZERO(dn)) {
    dn->digits=decShiftToMost(dn->lsu, dn->digits, shift);
    }
  dn->exponent-=shift;   /* adjust the exponent to match  */
  *status|=DEC_Clamped;  /* and record the dirty deed  */
  return;
  }